

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5_sha1.c
# Opt level: O0

int ossl_md5_sha1_ctrl(MD5_SHA1_CTX *mctx,int cmd,int mslen,void *ms)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  MD5_CTX *in_RDI;
  uchar sha1tmp [20];
  uchar md5tmp [16];
  uchar padtmp [48];
  MD5_SHA1_CTX *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  MD5_SHA1_CTX *in_stack_ffffffffffffff88;
  uchar local_68 [16];
  undefined1 local_58 [72];
  MD5_CTX *local_10;
  int local_4;
  
  if (in_ESI == 0x1d) {
    if (in_RDI == (MD5_CTX *)0x0) {
      local_4 = 0;
    }
    else if (in_EDX == 0x30) {
      local_10 = in_RDI;
      iVar1 = ossl_md5_sha1_update
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         (size_t)in_stack_ffffffffffffff78);
      if (iVar1 < 1) {
        local_4 = 0;
      }
      else {
        memset(local_58,0x36,0x30);
        iVar1 = MD5_Update(local_10,local_58,0x30);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          iVar1 = MD5_Final(local_68,(MD5_CTX *)local_10);
          if (iVar1 == 0) {
            local_4 = 0;
          }
          else {
            iVar1 = SHA1_Update((SHA_CTX *)(local_10 + 1),local_58,0x28);
            if (iVar1 == 0) {
              local_4 = 0;
            }
            else {
              iVar1 = SHA1_Final(&stack0xffffffffffffff78,(SHA_CTX *)(local_10 + 1));
              if (iVar1 == 0) {
                local_4 = 0;
              }
              else {
                iVar1 = ossl_md5_sha1_init(in_stack_ffffffffffffff78);
                if (iVar1 == 0) {
                  local_4 = 0;
                }
                else {
                  iVar1 = ossl_md5_sha1_update
                                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                     (size_t)in_stack_ffffffffffffff78);
                  if (iVar1 < 1) {
                    local_4 = 0;
                  }
                  else {
                    memset(local_58,0x5c,0x30);
                    iVar1 = MD5_Update(local_10,local_58,0x30);
                    if (iVar1 == 0) {
                      local_4 = 0;
                    }
                    else {
                      iVar1 = MD5_Update(local_10,local_68,0x10);
                      if (iVar1 == 0) {
                        local_4 = 0;
                      }
                      else {
                        iVar1 = SHA1_Update((SHA_CTX *)(local_10 + 1),local_58,0x28);
                        if (iVar1 == 0) {
                          local_4 = 0;
                        }
                        else {
                          iVar1 = SHA1_Update((SHA_CTX *)(local_10 + 1),&stack0xffffffffffffff78,
                                              0x14);
                          if (iVar1 == 0) {
                            local_4 = 0;
                          }
                          else {
                            OPENSSL_cleanse(local_68,0x10);
                            OPENSSL_cleanse(&stack0xffffffffffffff78,0x14);
                            local_4 = 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int ossl_md5_sha1_ctrl(MD5_SHA1_CTX *mctx, int cmd, int mslen, void *ms)
{
    unsigned char padtmp[48];
    unsigned char md5tmp[MD5_DIGEST_LENGTH];
    unsigned char sha1tmp[SHA_DIGEST_LENGTH];

    if (cmd != EVP_CTRL_SSL3_MASTER_SECRET)
        return -2;

    if (mctx == NULL)
        return 0;

    /* SSLv3 client auth handling: see RFC-6101 5.6.8 */
    if (mslen != 48)
        return 0;

    /* At this point hash contains all handshake messages, update
     * with master secret and pad_1.
     */

    if (ossl_md5_sha1_update(mctx, ms, mslen) <= 0)
        return 0;

    /* Set padtmp to pad_1 value */
    memset(padtmp, 0x36, sizeof(padtmp));

    if (!MD5_Update(&mctx->md5, padtmp, sizeof(padtmp)))
        return 0;

    if (!MD5_Final(md5tmp, &mctx->md5))
        return 0;

    if (!SHA1_Update(&mctx->sha1, padtmp, 40))
        return 0;

    if (!SHA1_Final(sha1tmp, &mctx->sha1))
        return 0;

    /* Reinitialise context */

    if (!ossl_md5_sha1_init(mctx))
        return 0;

    if (ossl_md5_sha1_update(mctx, ms, mslen) <= 0)
        return 0;

    /* Set padtmp to pad_2 value */
    memset(padtmp, 0x5c, sizeof(padtmp));

    if (!MD5_Update(&mctx->md5, padtmp, sizeof(padtmp)))
        return 0;

    if (!MD5_Update(&mctx->md5, md5tmp, sizeof(md5tmp)))
        return 0;

    if (!SHA1_Update(&mctx->sha1, padtmp, 40))
        return 0;

    if (!SHA1_Update(&mctx->sha1, sha1tmp, sizeof(sha1tmp)))
        return 0;

    /* Now when ctx is finalised it will return the SSL v3 hash value */

    OPENSSL_cleanse(md5tmp, sizeof(md5tmp));
    OPENSSL_cleanse(sha1tmp, sizeof(sha1tmp));

    return 1;
}